

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DFA.hpp
# Opt level: O0

void __thiscall
Centaurus::DFA<unsigned_char>::print(DFA<unsigned_char> *this,wostream *os,wstring *graph_name)

{
  bool bVar1;
  wostream *pwVar2;
  size_type sVar3;
  const_reference pvVar4;
  uint local_28;
  uint local_24;
  uint i_1;
  uint i;
  wstring *graph_name_local;
  wostream *os_local;
  DFA<unsigned_char> *this_local;
  
  pwVar2 = std::operator<<(os,L"digraph ");
  pwVar2 = std::operator<<(pwVar2,(wstring *)graph_name);
  pwVar2 = std::operator<<(pwVar2,L" {");
  std::wostream::operator<<(pwVar2,std::endl<wchar_t,std::char_traits<wchar_t>>);
  pwVar2 = std::operator<<(os,L"rankdir=\"LR\";");
  std::wostream::operator<<(pwVar2,std::endl<wchar_t,std::char_traits<wchar_t>>);
  pwVar2 = std::operator<<(os,L"graph [ charset=\"UTF-8\", style=\"filled\" ];");
  std::wostream::operator<<(pwVar2,std::endl<wchar_t,std::char_traits<wchar_t>>);
  pwVar2 = std::operator<<(os,L"node [ style=\"solid,filled\" ];");
  std::wostream::operator<<(pwVar2,std::endl<wchar_t,std::char_traits<wchar_t>>);
  pwVar2 = std::operator<<(os,L"edge [ style=\"solid\" ];");
  std::wostream::operator<<(pwVar2,std::endl<wchar_t,std::char_traits<wchar_t>>);
  pwVar2 = std::operator<<(os,L"SS [ style=\"invisible\" ];");
  std::wostream::operator<<(pwVar2,std::endl<wchar_t,std::char_traits<wchar_t>>);
  local_24 = 0;
  while( true ) {
    sVar3 = std::
            vector<Centaurus::DFAState<unsigned_char>,_std::allocator<Centaurus::DFAState<unsigned_char>_>_>
            ::size(&(this->super_NFABase<Centaurus::DFAState<unsigned_char>_>).m_states);
    if (sVar3 <= local_24) break;
    pwVar2 = std::operator<<(os,L"S");
    pwVar2 = (wostream *)std::wostream::operator<<(pwVar2,local_24);
    std::operator<<(pwVar2,L" [ label=\"");
    (*(this->super_NFABase<Centaurus::DFAState<unsigned_char>_>)._vptr_NFABase[2])
              (this,os,(ulong)local_24);
    pvVar4 = std::
             vector<Centaurus::DFAState<unsigned_char>,_std::allocator<Centaurus::DFAState<unsigned_char>_>_>
             ::operator[](&(this->super_NFABase<Centaurus::DFAState<unsigned_char>_>).m_states,
                          (ulong)local_24);
    bVar1 = DFAState<unsigned_char>::is_accept_state(pvVar4);
    if (bVar1) {
      std::operator<<(os,L"\", shape=doublecircle");
    }
    else {
      std::operator<<(os,L"\", shape=circle");
    }
    pvVar4 = std::
             vector<Centaurus::DFAState<unsigned_char>,_std::allocator<Centaurus::DFAState<unsigned_char>_>_>
             ::operator[](&(this->super_NFABase<Centaurus::DFAState<unsigned_char>_>).m_states,
                          (ulong)local_24);
    bVar1 = DFAState<unsigned_char>::is_long(pvVar4);
    if (bVar1) {
      pwVar2 = std::operator<<(os,L", penwidth=2 ];");
      std::wostream::operator<<(pwVar2,std::endl<wchar_t,std::char_traits<wchar_t>>);
    }
    else {
      pwVar2 = std::operator<<(os,L" ];");
      std::wostream::operator<<(pwVar2,std::endl<wchar_t,std::char_traits<wchar_t>>);
    }
    local_24 = local_24 + 1;
  }
  pwVar2 = std::operator<<(os,L"SS -> S0;");
  std::wostream::operator<<(pwVar2,std::endl<wchar_t,std::char_traits<wchar_t>>);
  local_28 = 0;
  while( true ) {
    sVar3 = std::
            vector<Centaurus::DFAState<unsigned_char>,_std::allocator<Centaurus::DFAState<unsigned_char>_>_>
            ::size(&(this->super_NFABase<Centaurus::DFAState<unsigned_char>_>).m_states);
    if (sVar3 <= local_28) break;
    pvVar4 = std::
             vector<Centaurus::DFAState<unsigned_char>,_std::allocator<Centaurus::DFAState<unsigned_char>_>_>
             ::operator[](&(this->super_NFABase<Centaurus::DFAState<unsigned_char>_>).m_states,
                          (ulong)local_28);
    (*(pvVar4->super_NFABaseState<unsigned_char,_Centaurus::IndexVector>)._vptr_NFABaseState[2])
              (pvVar4,os,(ulong)local_28);
    local_28 = local_28 + 1;
  }
  pwVar2 = std::operator<<(os,L"}");
  std::wostream::operator<<(pwVar2,std::endl<wchar_t,std::char_traits<wchar_t>>);
  return;
}

Assistant:

virtual void print(std::wostream& os, const std::wstring& graph_name) const override
	{
		os << L"digraph " << graph_name << L" {" << std::endl;
		os << L"rankdir=\"LR\";" << std::endl;
		os << L"graph [ charset=\"UTF-8\", style=\"filled\" ];" << std::endl;
		os << L"node [ style=\"solid,filled\" ];" << std::endl;
		os << L"edge [ style=\"solid\" ];" << std::endl;

		os << L"SS [ style=\"invisible\" ];" << std::endl;

		for (unsigned int i = 0; i < m_states.size(); i++)
		{
			os << L"S" << i << L" [ label=\"";
			print_state(os, i);
			if (m_states[i].is_accept_state())
				os << L"\", shape=doublecircle";
			else
				os << L"\", shape=circle";
            if (m_states[i].is_long())
                os << L", penwidth=2 ];" << std::endl;
            else
                os << L" ];" << std::endl;
		}

		os << L"SS -> S0;" << std::endl;

		for (unsigned int i = 0; i < m_states.size(); i++)
		{
			m_states[i].print(os, i);
		}

		os << L"}" << std::endl;
	}